

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::RenderDataPiece
          (DefaultValueObjectWriter *this,StringPiece name,DataPiece *data)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  TypeInfo *pTVar4;
  bool bVar5;
  int iVar6;
  LogMessage *pLVar7;
  Type **ppTVar8;
  Node *pNVar9;
  undefined4 extraout_var;
  StringPiece local_140;
  LogMessage local_130;
  undefined1 local_f8 [8];
  StatusOr<const_google::protobuf::Type_*> found_type;
  StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  data_string;
  StringPiece local_60;
  undefined1 local_50 [8];
  StringPiece name_local;
  LogFinisher local_31;
  
  name_local.ptr_ = (char *)name.length_;
  local_50 = (undefined1  [8])name.ptr_;
  MaybePopulateChildrenOfAny(this,this->current_);
  pTVar3 = this->current_->type_;
  if ((pTVar3 != (Type *)0x0) &&
     (bVar5 = std::operator==((pTVar3->name_).ptr_,"google.protobuf.Any"), bVar5)) {
    StringPiece::StringPiece(&local_140,"@type");
    bVar5 = operator==(name,local_140);
    if (bVar5) {
      DataPiece::ToString_abi_cxx11_
                ((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&found_type.value_,data);
      if ((int)found_type.value_ == 0) {
        name_local.length_ =
             (stringpiece_ssize_type)
             StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&found_type.value_);
        pTVar4 = this->typeinfo_;
        StringPiece::StringPiece<std::allocator<char>>
                  (&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   name_local.length_);
        (*pTVar4->_vptr_TypeInfo[2])(local_f8,pTVar4,local_60.ptr_,local_60.length_);
        if (local_f8._0_4_ == OK) {
          pNVar9 = this->current_;
          ppTVar8 = StatusOr<const_google::protobuf::Type_*>::value
                              ((StatusOr<const_google::protobuf::Type_*> *)local_f8);
          pNVar9->type_ = *ppTVar8;
        }
        else {
          protobuf::internal::LogMessage::LogMessage
                    (&local_130,LOGLEVEL_WARNING,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
                     ,0x255);
          pLVar7 = protobuf::internal::LogMessage::operator<<
                             (&local_130,"Failed to resolve type \'");
          pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,(string *)name_local.length_);
          pLVar7 = protobuf::internal::LogMessage::operator<<(pLVar7,"\'.");
          protobuf::internal::LogFinisher::operator=(&local_31,pLVar7);
          protobuf::internal::LogMessage::~LogMessage(&local_130);
        }
        pNVar9 = this->current_;
        pNVar9->is_any_ = true;
        if ((1 < (int)((ulong)((long)(pNVar9->children_).
                                     super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pNVar9->children_).
                                    super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
           (pNVar9->type_ != (Type *)0x0)) {
          (*pNVar9->_vptr_Node[2])(pNVar9,this->typeinfo_);
        }
        std::__cxx11::string::~string((string *)&found_type);
      }
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~StatusOr((StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&found_type.value_);
    }
  }
  pNVar9 = Node::FindChild(this->current_,name);
  if (pNVar9 == (Node *)0x0) {
    name_local.length_ = (stringpiece_ssize_type)data;
    StringPiece::ToString_abi_cxx11_((string *)&found_type.value_,(StringPiece *)local_50);
    pNVar9 = this->current_;
  }
  else {
    if (pNVar9->kind_ == PRIMITIVE) {
      DataPiece::InternalCopy(&pNVar9->data_,data);
      pNVar9->is_placeholder_ = false;
      return;
    }
    name_local.length_ = (stringpiece_ssize_type)data;
    StringPiece::ToString_abi_cxx11_((string *)&found_type.value_,(StringPiece *)local_50);
  }
  bVar5 = this->suppress_empty_list_;
  bVar1 = this->preserve_proto_field_names_;
  bVar2 = this->use_ints_for_enums_;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_google::protobuf::Field_*)>
              *)((long)&data_string.value_.field_2 + 8),&this->field_scrub_callback_);
  iVar6 = (*(this->super_ObjectWriter)._vptr_ObjectWriter[0x11])
                    (this,&found_type.value_,0,0,name_local.length_,0,&pNVar9->path_,(ulong)bVar5,
                     (ulong)bVar1,(ulong)bVar2,(undefined1 *)((long)&data_string.value_.field_2 + 8)
                    );
  std::_Function_base::~_Function_base((_Function_base *)((long)&data_string.value_.field_2 + 8));
  std::__cxx11::string::~string((string *)&found_type.value_);
  Node::AddChild(this->current_,(Node *)CONCAT44(extraout_var,iVar6));
  return;
}

Assistant:

void DefaultValueObjectWriter::RenderDataPiece(StringPiece name,
                                               const DataPiece& data) {
  MaybePopulateChildrenOfAny(current_);
  if (current_->type() != nullptr && current_->type()->name() == kAnyType &&
      name == "@type") {
    util::StatusOr<std::string> data_string = data.ToString();
    if (data_string.ok()) {
      const std::string& string_value = data_string.value();
      // If the type of current_ is "Any" and its "@type" field is being set
      // here, sets the type of current_ to be the type specified by the
      // "@type".
      util::StatusOr<const google::protobuf::Type*> found_type =
          typeinfo_->ResolveTypeUrl(string_value);
      if (!found_type.ok()) {
        GOOGLE_LOG(WARNING) << "Failed to resolve type '" << string_value << "'.";
      } else {
        current_->set_type(found_type.value());
      }
      current_->set_is_any(true);
      // If the "@type" field is placed after other fields, we should populate
      // other children of primitive type now. Otherwise, we should wait until
      // the first value field is rendered before we populate the children,
      // because the "value" field of a Any message could be omitted.
      if (current_->number_of_children() > 1 && current_->type() != nullptr) {
        current_->PopulateChildren(typeinfo_);
      }
    }
  }
  Node* child = current_->FindChild(name);
  if (child == nullptr || child->kind() != PRIMITIVE) {
    // No children are found, creates a new child.
    std::unique_ptr<Node> node(
        CreateNewNode(std::string(name), nullptr, PRIMITIVE, data, false,
                      child == nullptr ? current_->path() : child->path(),
                      suppress_empty_list_, preserve_proto_field_names_,
                      use_ints_for_enums_, field_scrub_callback_));
    current_->AddChild(node.release());
  } else {
    child->set_data(data);
    child->set_is_placeholder(false);
  }
}